

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Distributions.cpp
# Opt level: O0

unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
 Distributions::toCCDF(vector<double,_std::allocator<double>_> *distribution)

{
  size_type sVar1;
  const_reference pvVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *in_RSI;
  __uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
  in_RDI;
  int i;
  unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
  *result;
  pointer in_stack_ffffffffffffff48;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff50;
  allocator_type *in_stack_ffffffffffffff58;
  value_type_conflict4 *in_stack_ffffffffffffff60;
  value_type vVar4;
  size_type in_stack_ffffffffffffff68;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff70;
  vector<double,_std::allocator<double>_> *this;
  undefined4 local_40;
  
  operator_new(0x18);
  std::vector<double,_std::allocator<double>_>::size(in_RSI);
  std::allocator<double>::allocator((allocator<double> *)0x2a34b8);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  std::
  unique_ptr<std::vector<double,std::allocator<double>>,std::default_delete<std::vector<double,std::allocator<double>>>>
  ::unique_ptr<std::default_delete<std::vector<double,std::allocator<double>>>,void>
            ((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
              *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::allocator<double>::~allocator((allocator<double> *)0x2a34fa);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
  if (sVar1 != 0) {
    this = in_RSI;
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this,sVar1 - 1);
    vVar4 = *pvVar2;
    std::
    unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
    ::operator->((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                  *)0x2a3594);
    std::vector<double,_std::allocator<double>_>::size(in_RSI);
    pvVar3 = std::vector<double,_std::allocator<double>_>::at
                       (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
    *pvVar3 = vVar4;
    sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI);
    for (local_40 = (int)sVar1 + -2; -1 < local_40; local_40 = local_40 + -1) {
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_40);
      vVar4 = *pvVar2;
      std::
      unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
      ::operator->((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                    *)0x2a3612);
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      in_stack_ffffffffffffff50 = (vector<double,_std::allocator<double>_> *)(vVar4 + *pvVar3);
      std::
      unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
      ::operator->((unique_ptr<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
                    *)0x2a364d);
      pvVar3 = std::vector<double,_std::allocator<double>_>::at
                         (in_stack_ffffffffffffff50,(size_type)in_stack_ffffffffffffff48);
      *pvVar3 = (value_type)in_stack_ffffffffffffff50;
    }
  }
  return (__uniq_ptr_data<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>,_true,_true>
          )(tuple<std::vector<double,_std::allocator<double>_>_*,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
            )in_RDI.
             super___uniq_ptr_impl<std::vector<double,_std::allocator<double>_>,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::vector<double,_std::allocator<double>_>_*,_std::default_delete<std::vector<double,_std::allocator<double>_>_>_>
             .super__Head_base<0UL,_std::vector<double,_std::allocator<double>_>_*,_false>.
             _M_head_impl;
}

Assistant:

unique_ptr<vector<double> > Distributions::toCCDF(const vector<double>& distribution) {
	unique_ptr<vector<double> > result(new vector<double>(distribution.size(), 0.0));
	if (distribution.size() == 0) return result;
	result->at(distribution.size()-1) = distribution[distribution.size()-1];
	for (int i=distribution.size()-2; i>=0; --i) {
		result->at(i) = distribution[i] + result->at(i+1);
	}
	return result;
}